

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void AddSingleLiteralWithCostModel
               (uint32_t *argb,VP8LColorCache *hashers,CostModel *cost_model,int idx,
               int use_color_cache,float prev_cost,float *cost,uint16_t *dist_array)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  
  uVar1 = argb[idx];
  if (use_color_cache != 0) {
    uVar2 = uVar1 * 0x1e35a7bd >> ((byte)hashers->hash_shift_ & 0x1f);
    if ((-1 < (int)uVar2) && (hashers->colors_[(int)uVar2] == uVar1)) {
      dVar3 = cost_model->literal_[(int)(uVar2 + 0x118)] * 0.68;
      goto LAB_0013c867;
    }
    hashers->colors_[(int)uVar2] = uVar1;
  }
  dVar3 = (cost_model->alpha_[uVar1 >> 0x18] +
           *(double *)((long)cost_model->red_ + (ulong)(uVar1 >> 0xd & 0x7f8)) +
           cost_model->literal_[uVar1 >> 8 & 0xff] + cost_model->blue_[uVar1 & 0xff]) * 0.82;
LAB_0013c867:
  if (dVar3 + (double)prev_cost < (double)cost[idx]) {
    cost[idx] = (float)(dVar3 + (double)prev_cost);
    dist_array[idx] = 1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AddSingleLiteralWithCostModel(
    const uint32_t* const argb, VP8LColorCache* const hashers,
    const CostModel* const cost_model, int idx, int use_color_cache,
    float prev_cost, float* const cost, uint16_t* const dist_array) {
  double cost_val = prev_cost;
  const uint32_t color = argb[idx];
  const int ix = use_color_cache ? VP8LColorCacheContains(hashers, color) : -1;
  if (ix >= 0) {
    // use_color_cache is true and hashers contains color
    const double mul0 = 0.68;
    cost_val += GetCacheCost(cost_model, ix) * mul0;
  } else {
    const double mul1 = 0.82;
    if (use_color_cache) VP8LColorCacheInsert(hashers, color);
    cost_val += GetLiteralCost(cost_model, color) * mul1;
  }
  if (cost[idx] > cost_val) {
    cost[idx] = (float)cost_val;
    dist_array[idx] = 1;  // only one is inserted.
  }
}